

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.h
# Opt level: O0

duration __thiscall wallet::CWallet::ScanningDuration(CWallet *this)

{
  ulong uVar1;
  bool bVar2;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffc8;
  atomic<bool> *in_stack_ffffffffffffffe0;
  undefined1 local_10 [4];
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  *this_00;
  
  this_00 = *(atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
              **)(in_FS_OFFSET + 0x28);
  bVar2 = std::atomic::operator_cast_to_bool(in_stack_ffffffffffffffe0);
  if (bVar2) {
    std::chrono::_V2::steady_clock::now();
    uVar1 = (ulong)_local_10 >> 0x20;
    std::
    atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
    ::load(this_00,(memory_order)uVar1);
    _local_10 = std::chrono::operator-(in_RDI,in_stack_ffffffffffffffc8);
  }
  else {
    memset(local_10,0,8);
  }
  if (*(atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
        **)(in_FS_OFFSET + 0x28) == this_00) {
    return (duration)_local_10;
  }
  __stack_chk_fail();
}

Assistant:

SteadyClock::duration ScanningDuration() const { return fScanningWallet ? SteadyClock::now() - m_scanning_start.load() : SteadyClock::duration{}; }